

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

int fsg_search_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  fsg_lextree_t *pfVar1;
  fsg_search_t *fsgs;
  dict2pid_t *d2p_local;
  dict_t *dict_local;
  ps_search_t *search_local;
  
  if (search[1].name != (char *)0x0) {
    fsg_lextree_free((fsg_lextree_t *)search[1].name);
  }
  ps_search_base_reinit(search,dict,d2p);
  search->n_words = dict->n_word;
  pfVar1 = fsg_lextree_init((fsg_model_t *)search[1].type,dict,d2p,search->acmod->mdef,
                            (hmm_context_t *)search[1].vt,*(int32 *)((long)&search[1].last_link + 4)
                            ,*(int32 *)&search[1].last_link);
  search[1].name = (char *)pfVar1;
  fsg_history_set_fsg((fsg_history_t *)search[1].pls,(fsg_model_t *)search[1].type,dict);
  return 0;
}

Assistant:

int
fsg_search_reinit(ps_search_t *search, dict_t *dict, dict2pid_t *d2p)
{
    fsg_search_t *fsgs = (fsg_search_t *)search;

    /* Free the old lextree */
    if (fsgs->lextree)
        fsg_lextree_free(fsgs->lextree);

    /* Free old dict2pid, dict */
    ps_search_base_reinit(search, dict, d2p);
    
    /* Update the number of words (not used by this module though). */
    search->n_words = dict_size(dict);

    /* Allocate new lextree for the given FSG */
    fsgs->lextree = fsg_lextree_init(fsgs->fsg, dict, d2p,
                                     ps_search_acmod(fsgs)->mdef,
                                     fsgs->hmmctx, fsgs->wip, fsgs->pip);

    /* Inform the history module of the new fsg */
    fsg_history_set_fsg(fsgs->history, fsgs->fsg, dict);

    return 0;
}